

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMapping.cpp
# Opt level: O2

string * __thiscall
RewardModelMapping::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,RewardModelMapping *this)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  dVar4 = (double)std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,(string *)&this->_m_s_str);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->_m_ja_str);
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = std::operator<<(poVar1,"R(");
  poVar1 = std::operator<<(poVar1,(string *)&this->_m_s_str);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::operator<<(poVar1,(string *)&this->_m_ja_str);
  poVar1 = std::operator<<(poVar1,") (rewards of 0 are not printed)");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0; (ulong)uVar3 < (this->super_RewardModel)._m_nrStates; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; (ulong)uVar2 < (this->super_RewardModel)._m_nrJointActions; uVar2 = uVar2 + 1) {
      (**(this->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
         _vptr_QTableInterface)(this,(ulong)uVar3,(ulong)uVar2);
      if (dVar4 != 0.0) {
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        poVar1 = std::operator<<(poVar1,"\t");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(poVar1,"\t");
        poVar1 = std::ostream::_M_insert<double>(dVar4);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string RewardModelMapping::SoftPrint() const
{
    stringstream ss;
    double r;
    ss << _m_s_str <<"\t"<< _m_ja_str <<"\t"
       << "R(" << _m_s_str <<","<< _m_ja_str
       <<  ") (rewards of 0 are not printed)"<<endl;
    for(Index s_i = 0; s_i < GetNrStates(); s_i++)
        for(Index ja_i = 0; ja_i < GetNrJointActions(); ja_i++)
        {
            r=Get(s_i, ja_i);
            if(std::abs(r)>0)
                ss << s_i << "\t" << ja_i << "\t" << r << endl;
        }
    return(ss.str());
}